

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O0

void __thiscall QPDF_Array::QPDF_Array(QPDF_Array *this,QPDF_Array *other)

{
  bool bVar1;
  QPDF_Array *other_local;
  QPDF_Array *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)other);
  if (bVar1) {
    std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::operator*
              (&other->sp);
    std::make_unique<QPDF_Array::Sparse,QPDF_Array::Sparse&>((Sparse *)this);
  }
  else {
    std::unique_ptr<QPDF_Array::Sparse,std::default_delete<QPDF_Array::Sparse>>::
    unique_ptr<std::default_delete<QPDF_Array::Sparse>,void>
              ((unique_ptr<QPDF_Array::Sparse,std::default_delete<QPDF_Array::Sparse>> *)this,
               (nullptr_t)0x0);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->elements);
  return;
}

Assistant:

QPDF_Array(QPDF_Array const& other) :
        sp(other.sp ? std::make_unique<Sparse>(*other.sp) : nullptr)
    {
    }